

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void * plot_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_float tVar1;
  char cVar2;
  char *__s1;
  int iVar3;
  t_pd *object;
  _glist *p_Var4;
  t_symbol *ptVar5;
  t_pd *pp_Var6;
  bool bVar7;
  int iVar8;
  _fielddesc *fd;
  long lVar9;
  int local_9c;
  
  object = pd_new(plot_class);
  p_Var4 = canvas_getcurrent();
  object[6] = (t_pd)p_Var4;
  ptVar5 = gensym("x");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2a),ptVar5);
  ptVar5 = gensym("y");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2f),ptVar5);
  ptVar5 = gensym("w");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x34),ptVar5);
  *(undefined2 *)(object + 0x39) = 1;
  *(undefined4 *)(object + 0x3a) = 0x3f800000;
  object[0x3b] = (t_pd)0x0;
  object[0x3c] = (t_pd)0x0;
  *(undefined4 *)(object + 0x3d) = 0;
  *(undefined2 *)(object + 0x3e) = 1;
  *(undefined4 *)(object + 0x3f) = 0x3f800000;
  object[0x40] = (t_pd)0x0;
  object[0x41] = (t_pd)0x0;
  *(undefined4 *)(object + 0x42) = 0;
  *(undefined2 *)(object + 0x43) = 1;
  *(undefined4 *)(object + 0x44) = 0x3f800000;
  object[0x45] = (t_pd)0x0;
  object[0x46] = (t_pd)0x0;
  *(undefined4 *)(object + 0x47) = 0;
  local_9c = 1;
LAB_0015d0d7:
  ptVar5 = atom_getsymbolarg(0,argc,argv);
  __s1 = ptVar5->s_name;
  iVar3 = strcmp(__s1,"curve");
  lVar9 = 0x10;
  iVar8 = -1;
  if (iVar3 == 0) {
LAB_0015d192:
    local_9c = 2;
    iVar8 = -1;
    goto LAB_0015d3cd;
  }
  cVar2 = *__s1;
  if (cVar2 == '-') {
    if ((__s1[1] == 'c') && (__s1[2] == '\0')) goto LAB_0015d192;
    if (__s1[1] != 'v') goto LAB_0015d156;
    if ((1 < argc) && (__s1[2] == '\0')) {
      if (argv[1].a_type != A_SYMBOL) {
        tVar1 = argv[1].a_w.w_float;
        *(undefined2 *)(object + 0x39) = 1;
        *(t_float *)(object + 0x3a) = tVar1;
        pp_Var6 = object + 0x3b;
        goto LAB_0015d3b2;
      }
      ptVar5 = argv[1].a_w.w_symbol;
      fd = (_fielddesc *)(object + 0x39);
      goto LAB_0015d188;
    }
    iVar3 = strcmp(__s1,"-vs");
    if ((1 < argc) && (iVar3 == 0)) goto LAB_0015d171;
LAB_0015d1a9:
    bVar7 = 1 < argc;
    if ((__s1[1] == 'x') && (bVar7 && __s1[2] == '\0')) {
      if (argv[1].a_type == A_SYMBOL) {
        ptVar5 = argv[1].a_w.w_symbol;
        fd = (_fielddesc *)(object + 0x2a);
        goto LAB_0015d188;
      }
      tVar1 = argv[1].a_w.w_float;
      *(undefined2 *)(object + 0x2a) = 1;
      *(t_float *)(object + 0x2b) = tVar1;
      pp_Var6 = object + 0x2c;
LAB_0015d3b2:
      *pp_Var6 = (t_pd)0x0;
      pp_Var6[1] = (t_pd)0x0;
      *(undefined4 *)(pp_Var6 + 2) = 0;
      goto LAB_0015d3bc;
    }
    if ((__s1[1] == 'y') && (bVar7 && __s1[2] == '\0')) {
      if (argv[1].a_type != A_SYMBOL) {
        tVar1 = argv[1].a_w.w_float;
        *(undefined2 *)(object + 0x2f) = 1;
        *(t_float *)(object + 0x30) = tVar1;
        pp_Var6 = object + 0x31;
        goto LAB_0015d3b2;
      }
      ptVar5 = argv[1].a_w.w_symbol;
      fd = (_fielddesc *)(object + 0x2f);
      goto LAB_0015d188;
    }
    if ((__s1[1] == 'w') && (bVar7 && __s1[2] == '\0')) {
      if (argv[1].a_type == A_SYMBOL) {
        fielddesc_setfloat_var((_fielddesc *)(object + 0x34),argv[1].a_w.w_symbol);
      }
      else {
        tVar1 = argv[1].a_w.w_float;
        *(undefined2 *)(object + 0x34) = 1;
        *(t_float *)(object + 0x35) = tVar1;
        object[0x36] = (t_pd)0x0;
        object[0x37] = (t_pd)0x0;
        *(undefined4 *)(object + 0x38) = 0;
      }
      lVar9 = 0x20;
      iVar8 = -2;
    }
    else {
      if ((__s1[1] == 'e') && (bVar7 && __s1[2] == '\0')) {
        if (argv[1].a_type != A_SYMBOL) {
          tVar1 = argv[1].a_w.w_float;
          *(undefined2 *)(object + 0x43) = 1;
          *(t_float *)(object + 0x44) = tVar1;
          pp_Var6 = object + 0x45;
          goto LAB_0015d3b2;
        }
        ptVar5 = argv[1].a_w.w_symbol;
        fd = (_fielddesc *)(object + 0x43);
        goto LAB_0015d188;
      }
      pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,__s1);
    }
LAB_0015d3cd:
    argc = argc + iVar8;
    argv = (t_atom *)((long)&argv->a_type + lVar9);
    goto LAB_0015d0d7;
  }
LAB_0015d156:
  iVar3 = strcmp(__s1,"-vs");
  if ((1 < argc) && (iVar3 == 0)) {
LAB_0015d171:
    if (argv[1].a_type != A_SYMBOL) {
      tVar1 = argv[1].a_w.w_float;
      *(undefined2 *)(object + 0x3e) = 1;
      *(t_float *)(object + 0x3f) = tVar1;
      pp_Var6 = object + 0x40;
      goto LAB_0015d3b2;
    }
    ptVar5 = argv[1].a_w.w_symbol;
    fd = (_fielddesc *)(object + 0x3e);
LAB_0015d188:
    fielddesc_setfloat_var(fd,ptVar5);
LAB_0015d3bc:
    lVar9 = 0x20;
    iVar8 = -2;
    goto LAB_0015d3cd;
  }
  if (cVar2 == '-') goto LAB_0015d1a9;
  if (argc == 0) {
    *(undefined2 *)(object + 0x25) = 1;
    *(undefined4 *)(object + 0x26) = 0x3f800000;
    object[0x27] = (t_pd)0x0;
    object[0x28] = (t_pd)0x0;
    *(undefined4 *)(object + 0x29) = 0;
LAB_0015d5a8:
    *(undefined2 *)(object + 7) = 1;
    *(undefined4 *)(object + 8) = 0;
    object[9] = (t_pd)0x0;
    object[10] = (t_pd)0x0;
    *(undefined4 *)(object + 0xb) = 0;
LAB_0015d5bd:
    *(undefined2 *)(object + 0xc) = 1;
    *(undefined4 *)(object + 0xd) = 0x3f800000;
    object[0xe] = (t_pd)0x0;
    object[0xf] = (t_pd)0x0;
    *(undefined4 *)(object + 0x10) = 0;
LAB_0015d5db:
    *(undefined2 *)(object + 0x11) = 1;
    *(undefined4 *)(object + 0x12) = 0x3f800000;
    object[0x13] = (t_pd)0x0;
    object[0x14] = (t_pd)0x0;
    *(undefined4 *)(object + 0x15) = 0;
LAB_0015d602:
    *(undefined2 *)(object + 0x16) = 1;
    *(undefined4 *)(object + 0x17) = 0x3f800000;
    object[0x18] = (t_pd)0x0;
    object[0x19] = (t_pd)0x0;
    *(undefined4 *)(object + 0x1a) = 0;
  }
  else {
    iVar8 = argc + -1;
    if (argc < 1) {
      *(undefined2 *)(object + 0x25) = 1;
      *(undefined4 *)(object + 0x26) = 0;
      object[0x27] = (t_pd)0x0;
      object[0x28] = (t_pd)0x0;
      *(undefined4 *)(object + 0x29) = 0;
      fielddesc_setfloatarg((_fielddesc *)(object + 7),iVar8,argv + 1);
      fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argc + -2,argv + 2);
      fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argc + -3,argv + 3);
      fielddesc_setfloatarg((_fielddesc *)(object + 0x16),argc + -4,argv + 4);
      fielddesc_setfloatarg((_fielddesc *)(object + 0x1b),argc + -5,argv + 5);
LAB_0015d4cd:
      fielddesc_setfloatarg((_fielddesc *)(object + 0x20),argc + -6,argv + 6);
      return object;
    }
    if (argv->a_type == A_SYMBOL) {
      *(undefined2 *)(object + 0x25) = 0x137;
      *(word *)(object + 0x26) = argv->a_w;
    }
    else {
      tVar1 = (argv->a_w).w_float;
      *(undefined2 *)(object + 0x25) = 1;
      *(t_float *)(object + 0x26) = tVar1;
      object[0x27] = (t_pd)0x0;
      object[0x28] = (t_pd)0x0;
      *(undefined4 *)(object + 0x29) = 0;
    }
    if (iVar8 == 0) goto LAB_0015d5a8;
    fielddesc_setfloatarg((_fielddesc *)(object + 7),iVar8,argv + 1);
    if (argc + -2 == 0) goto LAB_0015d5bd;
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argc + -2,argv + 2);
    if (argc + -3 == 0) goto LAB_0015d5db;
    fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argc + -3,argv + 3);
    if (argc + -4 == 0) goto LAB_0015d602;
    fielddesc_setfloatarg((_fielddesc *)(object + 0x16),argc + -4,argv + 4);
    if (argc + -5 != 0) {
      fielddesc_setfloatarg((_fielddesc *)(object + 0x1b),argc + -5,argv + 5);
      if (argc != 6) goto LAB_0015d4cd;
      goto LAB_0015d650;
    }
  }
  *(undefined2 *)(object + 0x1b) = 1;
  *(undefined4 *)(object + 0x1c) = 0x3f800000;
  object[0x1d] = (t_pd)0x0;
  object[0x1e] = (t_pd)0x0;
  *(undefined4 *)(object + 0x1f) = 0;
LAB_0015d650:
  *(undefined2 *)(object + 0x20) = 1;
  *(float *)(object + 0x21) = (float)local_9c;
  object[0x22] = (t_pd)0x0;
  object[0x23] = (t_pd)0x0;
  *(undefined4 *)(object + 0x24) = 0;
  return object;
}

Assistant:

static void *plot_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_plot *x = (t_plot *)pd_new(plot_class);
    int defstyle = PLOTSTYLE_POLY;
    x->x_canvas = canvas_getcurrent();

    fielddesc_setfloat_var(&x->x_xpoints, gensym("x"));
    fielddesc_setfloat_var(&x->x_ypoints, gensym("y"));
    fielddesc_setfloat_var(&x->x_wpoints, gensym("w"));

    fielddesc_setfloat_const(&x->x_vis, 1);
    fielddesc_setfloat_const(&x->x_scalarvis, 1);
    fielddesc_setfloat_const(&x->x_edit, 1);
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "curve") ||
            !strcmp(firstarg->s_name, "-c"))
        {
            defstyle = PLOTSTYLE_BEZ;
            argc--, argv++;
        }
        else if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-vs") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_scalarvis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-x") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_xpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-y") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_ypoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-w") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_wpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-e") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_edit, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (*firstarg->s_name == '-')
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                firstarg->s_name);
            argc--; argv++;
        }
        else break;
    }
    if (argc) fielddesc_setarrayarg(&x->x_data, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_data, 1);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xinc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xinc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_style, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_style, defstyle);
    return (x);
}